

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall
pbrt::Instance::Instance(Instance *this,shared_ptr<pbrt::Object> *object,affine3f *xfm)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__0018e348;
  std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>,
             &object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
  fVar8 = (xfm->l).vx.x;
  fVar9 = (xfm->l).vx.y;
  uVar1 = *(undefined8 *)&(xfm->l).vx.z;
  fVar4 = (xfm->l).vy.y;
  fVar5 = (xfm->l).vy.z;
  fVar6 = (xfm->l).vz.x;
  fVar7 = (xfm->l).vz.y;
  fVar2 = (xfm->p).y;
  fVar3 = (xfm->p).z;
  *(undefined8 *)&(this->xfm).l.vz.z = *(undefined8 *)&(xfm->l).vz.z;
  (this->xfm).p.y = fVar2;
  (this->xfm).p.z = fVar3;
  (this->xfm).l.vy.y = fVar4;
  (this->xfm).l.vy.z = fVar5;
  (this->xfm).l.vz.x = fVar6;
  (this->xfm).l.vz.y = fVar7;
  (this->xfm).l.vx.x = fVar8;
  (this->xfm).l.vx.y = fVar9;
  *(undefined8 *)&(this->xfm).l.vx.z = uVar1;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  (this->bounds).lower.x = 3.4028235e+38;
  (this->bounds).lower.y = 3.4028235e+38;
  *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
  (this->bounds).upper.y = -3.4028235e+38;
  (this->bounds).upper.z = -3.4028235e+38;
  return;
}

Assistant:

Instance(const std::shared_ptr<Object> &object,
             const affine3f                &xfm)
      : object(object), xfm(xfm)
    {}